

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

void KINFree(void **kinmem)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pvVar1 = *kinmem;
  if (pvVar1 == (void *)0x0) {
    return;
  }
  if (*(N_Vector *)((long)pvVar1 + 0x108) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x108));
  }
  if (*(N_Vector *)((long)pvVar1 + 0x110) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x110));
  }
  if (*(N_Vector *)((long)pvVar1 + 0x130) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x130));
  }
  if (*(N_Vector *)((long)pvVar1 + 0x140) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x140));
  }
  if (*(N_Vector *)((long)pvVar1 + 0x148) != (N_Vector)0x0) {
    N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x148));
  }
  uVar2 = *(uint *)((long)pvVar1 + 0x28);
  if (uVar2 == 2) {
    if (*(N_Vector *)((long)pvVar1 + 0x118) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x118));
      uVar2 = *(uint *)((long)pvVar1 + 0x28);
      goto LAB_0010ba8f;
    }
  }
  else {
LAB_0010ba8f:
    if ((uVar2 & 0xfffffffe) != 2) goto LAB_0010bac5;
  }
  if (0 < *(long *)((long)pvVar1 + 400)) {
    free(*(void **)((long)pvVar1 + 0x180));
    free(*(void **)((long)pvVar1 + 0x178));
    free(*(void **)((long)pvVar1 + 0x188));
  }
LAB_0010bac5:
  if (*(long *)((long)pvVar1 + 400) == 0) {
    lVar3 = *(long *)((long)pvVar1 + 0x1b0);
    lVar4 = *(long *)((long)pvVar1 + 0x1b8);
    lVar5 = *(long *)((long)pvVar1 + 0x1c0);
    lVar6 = *(long *)((long)pvVar1 + 0x1c8);
  }
  else {
    if (*(N_Vector *)((long)pvVar1 + 0x150) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x150));
    }
    if (*(N_Vector *)((long)pvVar1 + 0x158) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x158));
    }
    N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x160),*(int *)((long)pvVar1 + 400));
    N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x168),*(int *)((long)pvVar1 + 400));
    free(*(void **)((long)pvVar1 + 0x1a0));
    free(*(void **)((long)pvVar1 + 0x1a8));
    lVar3 = *(long *)((long)pvVar1 + 0x1b0);
    lVar6 = *(long *)((long)pvVar1 + 400) * 2;
    lVar5 = (*(long *)((long)pvVar1 + 0x1c0) - lVar6 * lVar3) + -2;
    *(long *)((long)pvVar1 + 0x1c0) = lVar5;
    lVar4 = *(long *)((long)pvVar1 + 0x1b8);
    lVar6 = (*(long *)((long)pvVar1 + 0x1c8) - lVar6 * lVar4) + -2;
    *(long *)((long)pvVar1 + 0x1c8) = lVar6;
    if (*(int *)((long)pvVar1 + 0x198) != 0) {
      N_VDestroyVectorArray(*(N_Vector **)((long)pvVar1 + 0x170),(int)*(long *)((long)pvVar1 + 400))
      ;
      lVar3 = *(long *)((long)pvVar1 + 0x1b0);
      lVar5 = *(long *)((long)pvVar1 + 0x1c0) - lVar3 * *(long *)((long)pvVar1 + 400);
      lVar4 = *(long *)((long)pvVar1 + 0x1b8);
      lVar6 = *(long *)((long)pvVar1 + 0x1c8) - *(long *)((long)pvVar1 + 400) * lVar4;
    }
  }
  lVar5 = lVar3 * -5 + lVar5;
  *(long *)((long)pvVar1 + 0x1c0) = lVar5;
  lVar6 = lVar4 * -5 + lVar6;
  *(long *)((long)pvVar1 + 0x1c8) = lVar6;
  if (*(int *)((long)pvVar1 + 0x58) != 0) {
    if (*(N_Vector *)((long)pvVar1 + 0x138) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)pvVar1 + 0x138));
      lVar3 = *(long *)((long)pvVar1 + 0x1b0);
      lVar4 = *(long *)((long)pvVar1 + 0x1b8);
      lVar5 = *(long *)((long)pvVar1 + 0x1c0);
      lVar6 = *(long *)((long)pvVar1 + 0x1c8);
    }
    *(long *)((long)pvVar1 + 0x1c0) = lVar5 - lVar3;
    *(long *)((long)pvVar1 + 0x1c8) = lVar6 - lVar4;
  }
  if (*(code **)((long)pvVar1 + 0x1e8) != (code *)0x0) {
    (**(code **)((long)pvVar1 + 0x1e8))(pvVar1);
  }
  free(*kinmem);
  *kinmem = (void *)0x0;
  return;
}

Assistant:

void KINFree(void **kinmem)
{
  KINMem kin_mem;

  if (*kinmem == NULL) return;

  kin_mem = (KINMem) (*kinmem);
  KINFreeVectors(kin_mem);

  /* call lfree if non-NULL */

  if (kin_mem->kin_lfree != NULL) kin_mem->kin_lfree(kin_mem);

  free(*kinmem);
  *kinmem = NULL;
}